

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_lbd_create_cumulative_image.cpp
# Opt level: O0

void print_usage(FILE *stream,char **argv)

{
  char **argv_local;
  FILE *stream_local;
  
  fprintf((FILE *)stream,"Usage: %s ",*argv);
  fprintf((FILE *)stream,"[--lbd=freak|brief|rfreak|exfreak] ");
  fprintf((FILE *)stream,"[-n normalize=0] ");
  fprintf((FILE *)stream,"[-p psize=32] ");
  fprintf((FILE *)stream,"[-m M=512 ] ");
  fprintf((FILE *)stream,"result_image\n");
  return;
}

Assistant:

void print_usage(FILE *stream, char **argv)
{
  fprintf(stream, "Usage: %s ", argv[0]);
  fprintf(stream, "[--lbd=freak|brief|rfreak|exfreak] ");  
  fprintf(stream, "[-n normalize=0] ");
  fprintf(stream, "[-p psize=32] ");
  fprintf(stream, "[-m M=512 ] ");
  fprintf(stream, "result_image\n");
}